

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O1

string * __thiscall zmq::message_t::str_abi_cxx11_(string *__return_storage_ptr__,message_t *this)

{
  byte bVar1;
  uint *puVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  char *pcVar11;
  stringstream os;
  byte local_1c9;
  string *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c0 = zmq_msg_data(this);
  uVar6 = zmq_msg_size(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"zmq::message_t [size ",0x15);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
  lVar8 = *(long *)(local_1a8[0] + -0x18);
  cVar4 = (char)(ostream *)local_1a8;
  if (acStack_c8[lVar8 + 1] == '\0') {
    cVar5 = std::ios::widen(cVar4 + (char)lVar8);
    acStack_c8[lVar8] = cVar5;
    acStack_c8[lVar8 + 1] = '\x01';
  }
  acStack_c8[lVar8] = '0';
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] (",3);
  if (uVar6 < 1000) {
    pcVar11 = ")";
    if (uVar6 == 0) {
      lVar8 = 1;
    }
    else {
      uVar10 = 0;
      local_1c8 = __return_storage_ptr__;
      bVar9 = false;
      do {
        bVar3 = *(byte *)(local_1c0 + uVar10);
        bVar1 = bVar3 - 0x20;
        if (bVar9 != bVar1 < 0x5f) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        }
        if (bVar1 < 0x5f) {
          local_1c9 = bVar3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1c9,1);
        }
        else {
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
          *puVar2 = *puVar2 | 0x4000;
          *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
          lVar8 = *(long *)(local_1a8[0] + -0x18);
          if (acStack_c8[lVar8 + 1] == '\0') {
            cVar5 = std::ios::widen(cVar4 + (char)lVar8);
            acStack_c8[lVar8] = cVar5;
            acStack_c8[lVar8 + 1] = '\x01';
          }
          acStack_c8[lVar8] = '0';
          std::ostream::operator<<((ostream *)local_1a8,(ushort)bVar3);
        }
        uVar10 = uVar10 + 1;
        bVar9 = bVar1 < 0x5f;
      } while (uVar6 != uVar10);
      lVar8 = 1;
      pcVar11 = ")";
      __return_storage_ptr__ = local_1c8;
    }
  }
  else {
    lVar8 = 0x15;
    pcVar11 = "... too big to print)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
        // Partly mutuated from the same method in zmq::multipart_t
        std::stringstream os;

        const unsigned char *msg_data = this->data<unsigned char>();
        unsigned char byte;
        size_t size = this->size();
        int is_ascii[2] = {0, 0};

        os << "zmq::message_t [size " << std::dec << std::setw(3)
           << std::setfill('0') << size << "] (";
        // Totally arbitrary
        if (size >= 1000) {
            os << "... too big to print)";
        } else {
            while (size--) {
                byte = *msg_data++;

                is_ascii[1] = (byte >= 32 && byte < 127);
                if (is_ascii[1] != is_ascii[0])
                    os << " "; // Separate text/non text

                if (is_ascii[1]) {
                    os << byte;
                } else {
                    os << std::hex << std::uppercase << std::setw(2)
                       << std::setfill('0') << static_cast<short>(byte);
                }
                is_ascii[0] = is_ascii[1];
            }
            os << ")";
        }
        return os.str();
    }